

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O3

void __thiscall
ThreadContext::RegisterLazyBailout
          (ThreadContext *this,PropertyId propertyId,EntryPointInfo *entryPoint)

{
  Type pRVar1;
  PropertyRecord *propertyRecord;
  PropertyGuardEntry *pPVar2;
  Recycler *alloc;
  WeaklyReferencedKeyDictionary<Js::EntryPointInfo,_unsigned_char,_DefaultComparer<const_Js::EntryPointInfo_*>,_true>
  *pWVar3;
  Type *addr;
  undefined1 local_60 [8];
  TrackAllocData data;
  bool foundExistingGuard;
  
  propertyRecord = GetPropertyName(this,propertyId);
  pPVar2 = EnsurePropertyGuardEntry(this,propertyRecord,(bool *)&data.field_0x27);
  pWVar3 = (pPVar2->entryPoints).ptr;
  if (pWVar3 == (WeaklyReferencedKeyDictionary<Js::EntryPointInfo,_unsigned_char,_DefaultComparer<const_Js::EntryPointInfo_*>,_true>
                 *)0x0) {
    addr = &pPVar2->entryPoints;
    local_60 = (undefined1  [8])
               &JsUtil::
                WeaklyReferencedKeyDictionary<Js::EntryPointInfo,unsigned_char,DefaultComparer<Js::EntryPointInfo_const*>,true>
                ::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_314c66c;
    data.filename._0_4_ = 0xdd4;
    alloc = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_60);
    pWVar3 = (WeaklyReferencedKeyDictionary<Js::EntryPointInfo,_unsigned_char,_DefaultComparer<const_Js::EntryPointInfo_*>,_true>
              *)new<Memory::Recycler>(0x50,alloc,0x387914);
    pRVar1 = this->recycler;
    pWVar3->size = 0;
    pWVar3->count = 0;
    pWVar3->version = 0;
    pWVar3->freeList = 0;
    pWVar3->freeCount = 0;
    (pWVar3->buckets).ptr = (int *)0x0;
    (pWVar3->entries).ptr = (WeakRefDictionaryEntry<Js::EntryPointInfo,_unsigned_char> *)0x0;
    pWVar3->recycler = pRVar1;
    (pWVar3->entryRemovalCallback).cookie.ptr = (void *)0x0;
    pWVar3->lastWeakReferenceCleanupId = pRVar1->weakReferenceCleanupId;
    pWVar3->disableCleanup = false;
    pWVar3->modFunctionIndex = 0x4b;
    (pWVar3->entryRemovalCallback).fnCallback = (Type)0x0;
    JsUtil::
    WeaklyReferencedKeyDictionary<Js::EntryPointInfo,_unsigned_char,_DefaultComparer<const_Js::EntryPointInfo_*>,_true>
    ::Initialize(pWVar3,3);
    Memory::Recycler::WBSetBit((char *)addr);
    addr->ptr = pWVar3;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
    pWVar3 = addr->ptr;
  }
  JsUtil::
  WeaklyReferencedKeyDictionary<Js::EntryPointInfo,_unsigned_char,_DefaultComparer<const_Js::EntryPointInfo_*>,_true>
  ::Insert(pWVar3,entryPoint,'\0',true,false);
  return;
}

Assistant:

void
ThreadContext::RegisterLazyBailout(Js::PropertyId propertyId, Js::EntryPointInfo* entryPoint)
{
    const Js::PropertyRecord * propertyRecord = GetPropertyName(propertyId);

    bool foundExistingGuard;
    PropertyGuardEntry* entry = EnsurePropertyGuardEntry(propertyRecord, foundExistingGuard);
    if (!entry->entryPoints)
    {
        entry->entryPoints = RecyclerNew(recycler, PropertyGuardEntry::EntryPointDictionary, recycler, /*capacity*/ 3);
    }
    entry->entryPoints->UncheckedAdd(entryPoint, NULL);
}